

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTSEQEncStop(octet *der,size_t pos,der_anchor_t *anchor)

{
  bool bVar1;
  bool_t bVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong count;
  u32 tag;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  octet *src;
  
  tag = anchor->tag;
  bVar2 = derTIsValid(tag);
  if (bVar2 == 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = 0;
    if (tag != 0) {
      do {
        lVar3 = lVar3 + 1;
        bVar1 = 0xff < tag;
        tag = tag >> 8;
      } while (bVar1);
    }
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
  }
  uVar4 = anchor->len;
  lVar7 = 1;
  if (0x7f < uVar4) {
    do {
      lVar7 = lVar7 + 1;
      bVar1 = 0xff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar1);
  }
  uVar4 = lVar3 + lVar7 + anchor->pos;
  sVar8 = 0xffffffffffffffff;
  count = pos - uVar4;
  if (uVar4 <= pos) {
    sVar6 = 1;
    uVar4 = count;
    if (0x7f < count) {
      do {
        sVar6 = sVar6 + 1;
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
    sVar8 = sVar6 - lVar7;
    if (anchor->der != (octet *)0x0) {
      src = der + -count;
      memMove(src + sVar8,src,count);
      sVar5 = derLEnc(src + -lVar7,count);
      if (sVar5 != sVar6) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar8;
}

Assistant:

size_t derTSEQEncStop(octet der[], size_t pos, const der_anchor_t* anchor)
{
	size_t t_count;
	size_t l_count;
	size_t len;
	size_t l_count1;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	ASSERT(anchor->der == 0 ||
		der != 0 && anchor->der + pos == der + anchor->pos);
	// определить длину вложенных данных
	t_count = derTEnc(0, anchor->tag);
	l_count = derLEnc(0, anchor->len);
	if (anchor->pos + t_count + l_count > pos)
		return SIZE_MAX;
	len = pos - anchor->pos - t_count - l_count;
	l_count1 = derLEnc(0, len);
	// определить величину смещения вложенных данных
	pos = l_count1 - l_count;
	// сдвинуть вложенные данные и уточнить длину
	if (anchor->der)
	{
		ASSERT(anchor->der + t_count == der - len - l_count);
		memMove(der - len + pos, der - len, len);
		if (derLEnc(der - len - l_count, len) != l_count1)
			return SIZE_MAX;
	}
	return pos;
}